

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcc_functional_test.cc
# Opt level: O0

void crash_recovery_test(bool walflush)

{
  fdb_status fVar1;
  int iVar2;
  size_t metalen;
  void *pvVar3;
  fdb_kvs_handle *in_stack_fffffffffffffa78;
  fdb_file_handle *in_stack_fffffffffffffa80;
  fdb_doc **in_stack_fffffffffffffa88;
  size_t in_stack_fffffffffffffa90;
  char *in_stack_fffffffffffffa98;
  size_t in_stack_fffffffffffffaa0;
  fdb_file_info *in_stack_fffffffffffffab0;
  fdb_file_handle *in_stack_fffffffffffffab8;
  fdb_kvs_config kvs_config;
  fdb_config fconfig;
  char bodybuf [256];
  char metabuf [256];
  char keybuf [256];
  fdb_status status;
  char *test_file;
  uint64_t bid;
  fdb_file_info file_info;
  fdb_doc *rdoc;
  fdb_doc **doc;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  int n;
  int r;
  int i;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  bool walflush_local;
  
  gettimeofday((timeval *)&__test_prev.tv_usec,(__timezone_ptr_t)0x0);
  memleak_start();
  system("rm -rf  mvcc_test* > errorlog.txt");
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  fconfig.chunksize = 0;
  fconfig._2_2_ = 0;
  fconfig.blocksize = 0;
  fconfig.wal_flush_before_commit = true;
  fconfig.buffercache_size = 0x400;
  fconfig.purging_interval = 1;
  fconfig.flags._3_1_ = 0;
  fdb_open((fdb_file_handle **)bodybuf._152_8_,(char *)bodybuf._144_8_,(fdb_config *)bodybuf._136_8_
          );
  fdb_kvs_open_default
            (in_stack_fffffffffffffa80,(fdb_kvs_handle **)in_stack_fffffffffffffa78,
             (fdb_kvs_config *)0x105202);
  fVar1 = fdb_set_log_callback((fdb_kvs_handle *)doc,logCallbackFunc,"crash_recovery_test");
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x106);
    crash_recovery_test::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x106,"void crash_recovery_test(bool)");
    }
  }
  for (n = 0; n < 10; n = n + 1) {
    sprintf(metabuf + 0xf8,"key%d",(ulong)(uint)n);
    sprintf(bodybuf + 0xf8,"meta%d",(ulong)(uint)n);
    sprintf((char *)&fconfig.num_blocks_readahead,"body%d",(ulong)(uint)n);
    strlen(metabuf + 0xf8);
    strlen(bodybuf + 0xf8);
    pvVar3 = (void *)0x105352;
    metalen = strlen((char *)&fconfig.num_blocks_readahead);
    fdb_doc_create(in_stack_fffffffffffffa88,in_stack_fffffffffffffa80,
                   (size_t)in_stack_fffffffffffffa78,pvVar3,metalen,(void *)0x105389,
                   in_stack_fffffffffffffaa0);
    fdb_set((fdb_kvs_handle *)doc,*(fdb_doc **)(&stack0xfffffffffffffa78 + (long)n * 8));
  }
  if (walflush) {
    fVar1 = fdb_commit((fdb_file_handle *)in_stack_fffffffffffffa78,'\0');
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x115);
      crash_recovery_test::__test_pass = 0;
      if (fVar1 != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0x115,"void crash_recovery_test(bool)");
      }
    }
  }
  else {
    fVar1 = fdb_commit((fdb_file_handle *)in_stack_fffffffffffffa78,'\0');
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x118);
      crash_recovery_test::__test_pass = 0;
      if (fVar1 != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0x118,"void crash_recovery_test(bool)");
      }
    }
  }
  fVar1 = fdb_get_file_info(in_stack_fffffffffffffab8,in_stack_fffffffffffffab0);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x11c);
    crash_recovery_test::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x11c,"void crash_recovery_test(bool)");
    }
  }
  fdb_kvs_close(in_stack_fffffffffffffa78);
  fdb_close((fdb_file_handle *)in_stack_fffffffffffffa78);
  fdb_shutdown();
  iVar2 = _disk_dump(in_stack_fffffffffffffa98,in_stack_fffffffffffffa90,
                     (size_t)in_stack_fffffffffffffa88);
  if (iVar2 < 0) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x129);
    crash_recovery_test::__test_pass = 0;
    if (iVar2 < 0) {
      __assert_fail("r >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x129,"void crash_recovery_test(bool)");
    }
  }
  fVar1 = fdb_open((fdb_file_handle **)bodybuf._152_8_,(char *)bodybuf._144_8_,
                   (fdb_config *)bodybuf._136_8_);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x12d);
    crash_recovery_test::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x12d,"void crash_recovery_test(bool)");
    }
  }
  fVar1 = fdb_kvs_open_default
                    (in_stack_fffffffffffffa80,(fdb_kvs_handle **)in_stack_fffffffffffffa78,
                     (fdb_kvs_config *)0x105679);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x12f);
    crash_recovery_test::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x12f,"void crash_recovery_test(bool)");
    }
  }
  pvVar3 = (void *)0x1056f9;
  fVar1 = fdb_set_log_callback((fdb_kvs_handle *)doc,logCallbackFunc,"crash_recovery_test");
  if (fVar1 != FDB_RESULT_SUCCESS) {
    pvVar3 = (void *)0x10572c;
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x132);
    crash_recovery_test::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x132,"void crash_recovery_test(bool)");
    }
  }
  n = 0;
  while( true ) {
    if (9 < n) {
      n = 0;
      do {
        if (9 < n) {
          for (n = 0; n < 10; n = n + 1) {
            fdb_doc_free((fdb_doc *)0x105a9c);
          }
          fdb_kvs_close(in_stack_fffffffffffffa78);
          fdb_close((fdb_file_handle *)in_stack_fffffffffffffa78);
          fdb_shutdown();
          memleak_end();
          if (walflush) {
            if (crash_recovery_test::__test_pass == 0) {
              fprintf(_stderr,"%s FAILED\n","crash recovery test - walflush");
            }
            else {
              fprintf(_stderr,"%s PASSED\n","crash recovery test - walflush");
            }
          }
          else if (crash_recovery_test::__test_pass == 0) {
            fprintf(_stderr,"%s FAILED\n","crash recovery test - normal flush");
          }
          else {
            fprintf(_stderr,"%s PASSED\n","crash recovery test - normal flush");
          }
          return;
        }
        fdb_doc_create(in_stack_fffffffffffffa88,in_stack_fffffffffffffa80,
                       (size_t)in_stack_fffffffffffffa78,pvVar3,0,(void *)0x1059ce,
                       in_stack_fffffffffffffaa0);
        *(long *)(file_info.num_live_nodes + 0x28) = (long)(n + 1);
        fVar1 = fdb_get_byseq((fdb_kvs_handle *)doc,(fdb_doc *)file_info.num_live_nodes);
        if (fVar1 != FDB_RESULT_SUCCESS) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x149);
          crash_recovery_test::__test_pass = 0;
          if (fVar1 != FDB_RESULT_SUCCESS) {
            __assert_fail("status == FDB_RESULT_SUCCESS",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                          ,0x149,"void crash_recovery_test(bool)");
          }
        }
        pvVar3 = (void *)0x105a6b;
        fdb_doc_free((fdb_doc *)0x105a6b);
        n = n + 1;
      } while( true );
    }
    fdb_doc_create(in_stack_fffffffffffffa88,in_stack_fffffffffffffa80,
                   (size_t)in_stack_fffffffffffffa78,pvVar3,0,(void *)0x1057bd,
                   in_stack_fffffffffffffaa0);
    fVar1 = fdb_get((fdb_kvs_handle *)doc,(fdb_doc *)file_info.num_live_nodes);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x13a);
      crash_recovery_test::__test_pass = 0;
      if (fVar1 != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0x13a,"void crash_recovery_test(bool)");
      }
    }
    iVar2 = memcmp(*(void **)(file_info.num_live_nodes + 0x38),
                   *(void **)(*(long *)(&stack0xfffffffffffffa78 + (long)n * 8) + 0x38),
                   *(size_t *)(file_info.num_live_nodes + 8));
    if (iVar2 != 0) break;
    iVar2 = memcmp(*(void **)(file_info.num_live_nodes + 0x40),
                   *(void **)(*(long *)(&stack0xfffffffffffffa78 + (long)n * 8) + 0x40),
                   *(size_t *)(file_info.num_live_nodes + 0x10));
    if (iVar2 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
              *(undefined8 *)(*(long *)(&stack0xfffffffffffffa78 + (long)n * 8) + 0x40),
              *(undefined8 *)(file_info.num_live_nodes + 0x40),
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x13c);
      crash_recovery_test::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x13c,"void crash_recovery_test(bool)");
    }
    pvVar3 = (void *)0x105984;
    fdb_doc_free((fdb_doc *)0x105984);
    n = n + 1;
  }
  fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
          *(undefined8 *)(*(long *)(&stack0xfffffffffffffa78 + (long)n * 8) + 0x38),
          *(undefined8 *)(file_info.num_live_nodes + 0x38),
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
          ,0x13b);
  crash_recovery_test::__test_pass = 0;
  __assert_fail("false",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x13b,"void crash_recovery_test(bool)");
}

Assistant:

void crash_recovery_test(bool walflush)
{
    TEST_INIT();

    memleak_start();

    int i, r;
    int n = 10;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_doc *rdoc;
    fdb_file_info file_info;
    uint64_t bid;
    const char *test_file = "./mvcc_test2";
    fdb_status status;

    char keybuf[256], metabuf[256], bodybuf[256];

    // remove previous mvcc_test files
    r = system(SHELL_DEL" mvcc_test* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.buffercache_size = 0;
    fconfig.seqtree_opt = FDB_SEQTREE_USE; // enable seqtree since get_byseq
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_threshold = 0;

    // reopen db
    fdb_open(&dbfile, test_file, &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);
    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "crash_recovery_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // insert documents
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        fdb_set(db, doc[i]);
    }

    // commit
    if(walflush){
        status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    } else {
        status = fdb_commit(dbfile, FDB_COMMIT_NORMAL);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }

    status = fdb_get_file_info(dbfile, &file_info);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    bid = file_info.file_size / fconfig.blocksize;

    // close the db
    fdb_kvs_close(db);
    fdb_close(dbfile);

    // Shutdown forest db in the middle of the test to simulate crash
    fdb_shutdown();

    // append 9K of non-block aligned garbage at end of file
    r = _disk_dump(test_file, bid * fconfig.blocksize,
                   (2 * fconfig.blocksize) + (fconfig.blocksize / 4));
    TEST_CHK(r >= 0);

    // reopen the same file
    status = fdb_open(&dbfile, test_file, &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_kvs_open_default(dbfile, &db, &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "crash_recovery_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // retrieve documents
    for (i=0;i<n;++i){
        // search by key
        fdb_doc_create(&rdoc, doc[i]->key, doc[i]->keylen, NULL, 0, NULL, 0);
        status = fdb_get(db, rdoc);

        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
        TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);

        // free result document
        fdb_doc_free(rdoc);
    }

    // retrieve documents by sequence number
    for (i=0;i<n;++i){
        // search by seq
        fdb_doc_create(&rdoc, NULL, 0, NULL, 0, NULL, 0);
        rdoc->seqnum = i + 1;
        status = fdb_get_byseq(db, rdoc);

        TEST_CHK(status == FDB_RESULT_SUCCESS);

        // free result document
        fdb_doc_free(rdoc);
    }

    // free all documents
    for (i=0;i<n;++i){
        fdb_doc_free(doc[i]);
    }

    // close db file
    fdb_kvs_close(db);
    fdb_close(dbfile);

    // free all resources
    fdb_shutdown();

    memleak_end();

    if(walflush){
        TEST_RESULT("crash recovery test - walflush");
    } else {
        TEST_RESULT("crash recovery test - normal flush");
    }
}